

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O0

utf8proc_ssize_t
duckdb::utf8proc_decompose_char
          (utf8proc_int32_t uc,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  short sVar1;
  utf8proc_bool uVar2;
  int iVar3;
  utf8proc_property_t *state;
  uint in_ECX;
  utf8proc_int32_t *in_RDX;
  utf8proc_option_t *in_RSI;
  utf8proc_option_t in_EDI;
  undefined8 in_R8;
  utf8proc_option_t options_00;
  utf8proc_bool boundary;
  utf8proc_int32_t hangul_tindex;
  utf8proc_int32_t *unaff_retaddr;
  utf8proc_int32_t hangul_sindex;
  utf8proc_propval_t category;
  utf8proc_property_t *property;
  int in_stack_ffffffffffffffd8;
  utf8proc_int32_t uc_00;
  utf8proc_ssize_t in_stack_fffffffffffffff8;
  utf8proc_ssize_t uVar4;
  
  options_00 = (utf8proc_option_t)((ulong)in_R8 >> 0x20);
  if (((int)in_EDI < 0) || (0x10ffff < (int)in_EDI)) {
    uVar4 = -4;
  }
  else {
    state = unsafe_get_property(in_EDI);
    sVar1 = state->category;
    iVar3 = in_EDI - 0xac00;
    if ((((in_ECX & 0x18) == 0) || (iVar3 < 0)) || (0x2ba3 < iVar3)) {
      if (((in_ECX & 0x40) == 0) || (sVar1 != 0)) {
        if (((in_ECX & 0x20) == 0) || ((*(ushort *)&state->field_0x14 >> 2 & 1) == 0)) {
          if (((in_ECX & 0x4000) == 0) || (sVar1 != 0)) {
            if ((in_ECX & 0x1000) != 0) {
              uc_00 = (utf8proc_int32_t)((ulong)in_RSI >> 0x20);
              if (sVar1 == 0x17) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if ((((in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) ||
                   (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE|
                              UTF8PROC_NULLTERM))) ||
                  (in_EDI == (UTF8PROC_STRIPCC|UTF8PROC_NLF2LS|UTF8PROC_IGNORE|UTF8PROC_DECOMPOSE|
                              UTF8PROC_COMPOSE|UTF8PROC_COMPAT))) ||
                 (in_EDI == (UTF8PROC_STRIPCC|UTF8PROC_NLF2LS|UTF8PROC_REJECTNA|UTF8PROC_COMPOSE)))
              {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if ((sVar1 == 0xd) ||
                 (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_DECOMPOSE|UTF8PROC_STABLE)
                 )) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if ((in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_REJECTNA|UTF8PROC_COMPAT)) ||
                 (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_DECOMPOSE|UTF8PROC_COMPAT|
                            UTF8PROC_NULLTERM))) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_IGNORE|UTF8PROC_DECOMPOSE|
                             UTF8PROC_COMPAT|UTF8PROC_STABLE)) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (((in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_IGNORE|UTF8PROC_DECOMPOSE|
                               UTF8PROC_COMPOSE|UTF8PROC_NULLTERM)) ||
                  (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_NLF2PS|UTF8PROC_IGNORE|
                              UTF8PROC_COMPOSE|UTF8PROC_NULLTERM))) ||
                 (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_LUMP|UTF8PROC_COMPOSE))) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (((in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_IGNORE|UTF8PROC_DECOMPOSE|
                               UTF8PROC_COMPOSE|UTF8PROC_STABLE)) ||
                  (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_NLF2PS|UTF8PROC_IGNORE|
                              UTF8PROC_COMPOSE|UTF8PROC_STABLE))) ||
                 (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_LUMP|UTF8PROC_COMPOSE|UTF8PROC_NULLTERM)))
              {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_DECOMPOSE|UTF8PROC_COMPAT|
                            UTF8PROC_STABLE)) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (((in_EDI == (UTF8PROC_STRIPCC|UTF8PROC_NLF2LS|UTF8PROC_REJECTNA|UTF8PROC_COMPAT))
                  || (in_EDI == (UTF8PROC_STRIPCC|UTF8PROC_NLF2LS|UTF8PROC_REJECTNA|UTF8PROC_COMPAT|
                                UTF8PROC_STABLE))) ||
                 ((in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_IGNORE|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE
                             ) ||
                  (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_NLF2PS|UTF8PROC_STABLE|
                             UTF8PROC_NULLTERM))))) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if ((sVar1 == 0xc) ||
                 (in_EDI == (UTF8PROC_STRIPCC|UTF8PROC_NLF2LS|UTF8PROC_REJECTNA|UTF8PROC_COMPOSE|
                             UTF8PROC_COMPAT|UTF8PROC_NULLTERM))) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (in_EDI == (UTF8PROC_STRIPCC|UTF8PROC_NLF2LS|UTF8PROC_REJECTNA|UTF8PROC_COMPOSE|
                             UTF8PROC_STABLE|UTF8PROC_NULLTERM)) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_IGNORE|UTF8PROC_STABLE|
                            UTF8PROC_NULLTERM)) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if (in_EDI == (UTF8PROC_STRIPMARK|UTF8PROC_STRIPCC|UTF8PROC_IGNORE|UTF8PROC_DECOMPOSE|
                             UTF8PROC_COMPOSE|UTF8PROC_COMPAT)) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
              if ((((in_ECX & 0x80) != 0) && ((in_ECX & 0x100) != 0)) &&
                 ((sVar1 == 0x18 || (sVar1 == 0x19)))) {
                uVar4 = utf8proc_decompose_char
                                  (uc_00,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   options_00,(int *)state);
                return uVar4;
              }
            }
            if (((in_ECX & 0x2000) == 0) || (((sVar1 != 6 && (sVar1 != 7)) && (sVar1 != 8)))) {
              if (((in_ECX & 0x400) == 0) || (state->casefold_seqindex == 0xffff)) {
                if (((in_ECX & 0x18) == 0) ||
                   ((state->decomp_seqindex == 0xffff ||
                    ((state->decomp_type != 0 && ((in_ECX & 4) == 0)))))) {
                  if (((in_ECX & 0x800) == 0) ||
                     (uVar2 = grapheme_break_extended
                                        ((int)in_RDX,in_ECX,in_stack_ffffffffffffffd8,options_00,
                                         (utf8proc_int32_t *)state), !uVar2)) {
                    if (0 < (long)in_RDX) {
                      *in_RSI = in_EDI;
                    }
                    uVar4 = 1;
                  }
                  else {
                    if (0 < (long)in_RDX) {
                      *in_RSI = 0xffffffff;
                    }
                    if (1 < (long)in_RDX) {
                      in_RSI[1] = in_EDI;
                    }
                    uVar4 = 2;
                  }
                }
                else {
                  uVar4 = seqindex_write_char_decomposed
                                    (category,unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,
                                     (int *)in_RSI);
                }
              }
              else {
                uVar4 = seqindex_write_char_decomposed
                                  (category,unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,
                                   (int *)in_RSI);
              }
            }
            else {
              uVar4 = 0;
            }
          }
          else {
            uVar4 = 0;
          }
        }
        else {
          uVar4 = 0;
        }
      }
      else {
        uVar4 = -4;
      }
    }
    else {
      if ((0 < (long)in_RDX) &&
         (*in_RSI = iVar3 / 0x24c + (UTF8PROC_LUMP|UTF8PROC_NLF2PS), 1 < (long)in_RDX)) {
        in_RSI[1] = (int)((long)((ulong)(uint)((int)((long)iVar3 % 0x24c) >> 0x1f) << 0x20 |
                                (long)iVar3 % 0x24c & 0xffffffffU) / 0x1c) +
                    (UTF8PROC_LUMP|UTF8PROC_NLF2PS|UTF8PROC_REJECTNA|UTF8PROC_IGNORE|
                    UTF8PROC_NULLTERM);
      }
      if (iVar3 % 0x1c == 0) {
        uVar4 = 2;
      }
      else {
        if (2 < (long)in_RDX) {
          in_RSI[2] = iVar3 % 0x1c +
                      (UTF8PROC_LUMP|UTF8PROC_NLF2LF|UTF8PROC_IGNORE|UTF8PROC_COMPAT|UTF8PROC_STABLE
                      |UTF8PROC_NULLTERM);
        }
        uVar4 = 3;
      }
    }
  }
  return uVar4;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_char(utf8proc_int32_t uc, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  const utf8proc_property_t *property;
  utf8proc_propval_t category;
  utf8proc_int32_t hangul_sindex;
  if (uc < 0 || uc >= 0x110000) return UTF8PROC_ERROR_NOTASSIGNED;
  property = unsafe_get_property(uc);
  category = property->category;
  hangul_sindex = uc - UTF8PROC_HANGUL_SBASE;
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT) {
      utf8proc_int32_t hangul_tindex;
      if (bufsize >= 1) {
        dst[0] = UTF8PROC_HANGUL_LBASE +
          hangul_sindex / UTF8PROC_HANGUL_NCOUNT;
        if (bufsize >= 2) dst[1] = UTF8PROC_HANGUL_VBASE +
          (hangul_sindex % UTF8PROC_HANGUL_NCOUNT) / UTF8PROC_HANGUL_TCOUNT;
      }
      hangul_tindex = hangul_sindex % UTF8PROC_HANGUL_TCOUNT;
      if (!hangul_tindex) return 2;
      if (bufsize >= 3) dst[2] = UTF8PROC_HANGUL_TBASE + hangul_tindex;
      return 3;
    }
  }
  if (options & UTF8PROC_REJECTNA) {
    if (!category) return UTF8PROC_ERROR_NOTASSIGNED;
  }
  if (options & UTF8PROC_IGNORE) {
    if (property->ignorable) return 0;
  }
  if (options & UTF8PROC_STRIPNA) {
    if (!category) return 0;
  }
  if (options & UTF8PROC_LUMP) {
    if (category == UTF8PROC_CATEGORY_ZS) utf8proc_decompose_lump(0x0020);
    if (uc == 0x2018 || uc == 0x2019 || uc == 0x02BC || uc == 0x02C8)
      utf8proc_decompose_lump(0x0027);
    if (category == UTF8PROC_CATEGORY_PD || uc == 0x2212)
      utf8proc_decompose_lump(0x002D);
    if (uc == 0x2044 || uc == 0x2215) utf8proc_decompose_lump(0x002F);
    if (uc == 0x2236) utf8proc_decompose_lump(0x003A);
    if (uc == 0x2039 || uc == 0x2329 || uc == 0x3008)
      utf8proc_decompose_lump(0x003C);
    if (uc == 0x203A || uc == 0x232A || uc == 0x3009)
      utf8proc_decompose_lump(0x003E);
    if (uc == 0x2216) utf8proc_decompose_lump(0x005C);
    if (uc == 0x02C4 || uc == 0x02C6 || uc == 0x2038 || uc == 0x2303)
      utf8proc_decompose_lump(0x005E);
    if (category == UTF8PROC_CATEGORY_PC || uc == 0x02CD)
      utf8proc_decompose_lump(0x005F);
    if (uc == 0x02CB) utf8proc_decompose_lump(0x0060);
    if (uc == 0x2223) utf8proc_decompose_lump(0x007C);
    if (uc == 0x223C) utf8proc_decompose_lump(0x007E);
    if ((options & UTF8PROC_NLF2LS) && (options & UTF8PROC_NLF2PS)) {
      if (category == UTF8PROC_CATEGORY_ZL ||
          category == UTF8PROC_CATEGORY_ZP)
        utf8proc_decompose_lump(0x000A);
    }
  }
  if (options & UTF8PROC_STRIPMARK) {
    if (category == UTF8PROC_CATEGORY_MN ||
      category == UTF8PROC_CATEGORY_MC ||
      category == UTF8PROC_CATEGORY_ME) return 0;
  }
  if (options & UTF8PROC_CASEFOLD) {
    if (property->casefold_seqindex != UINT16_MAX) {
      return seqindex_write_char_decomposed(property->casefold_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (property->decomp_seqindex != UINT16_MAX &&
        (!property->decomp_type || (options & UTF8PROC_COMPAT))) {
      return seqindex_write_char_decomposed(property->decomp_seqindex, dst, bufsize, options, last_boundclass);
        }
  }
  if (options & UTF8PROC_CHARBOUND) {
    utf8proc_bool boundary;
    boundary = grapheme_break_extended(0, property->boundclass, 0, property->indic_conjunct_break,
                                       last_boundclass);
    if (boundary) {
      if (bufsize >= 1) dst[0] = -1; /* sentinel value for grapheme break */
      if (bufsize >= 2) dst[1] = uc;
      return 2;
    }
  }
  if (bufsize >= 1) *dst = uc;
  return 1;
}